

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O2

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::Backward
          (TPZFileEqnStorage<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *f,
          DecomposeType dec)

{
  long __off;
  uint uVar1;
  int64_t position;
  TPZEqnArray<std::complex<float>_> REqnArray;
  
  TPZEqnArray<std::complex<float>_>::TPZEqnArray(&REqnArray);
  uVar1 = (uint)(this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  while (uVar1 = uVar1 - 1, -1 < (int)uVar1) {
    __off = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore
            [uVar1 & 0x7fffffff];
    if (__off != 0) {
      fseek((FILE *)this->fIOStream,__off,0);
      fread(&position,8,1,(FILE *)this->fIOStream);
      fseek((FILE *)this->fIOStream,position,0);
      TPZEqnArray<std::complex<float>_>::Read(&REqnArray,this->fIOStream);
      TPZEqnArray<std::complex<float>_>::EqnBackward(&REqnArray,f,dec);
    }
  }
  TPZEqnArray<std::complex<float>_>::~TPZEqnArray(&REqnArray);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Backward(TPZFMatrix<TVar> &f, DecomposeType dec) const
{
	TPZEqnArray<TVar> REqnArray;
	int i;
	int64_t sizereturn;
	sizereturn = 0;
	for(i=fBlockPos.NElements()-1;i>=0;i--){
		if (fBlockPos[i]) {
			fseek(fIOStream,fBlockPos[i],SEEK_SET);
			int64_t position;
			sizereturn = fread(&position,sizeof(int64_t),1,fIOStream);
#ifdef PZDEBUG
			if (sizereturn != 1) DebugStop();
#endif
			fseek(fIOStream,position,SEEK_SET);
			REqnArray.Read(fIOStream);
			REqnArray.EqnBackward(f,dec); 
		}
	}
}